

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test::testBody
          (TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  undefined4 extraout_var_01;
  SimpleString SStack_38;
  SimpleString local_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_38,"boo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&SStack_38);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_38,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&SStack_38);
  SimpleString::SimpleString(&local_18,"p");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
            ((long *)CONCAT44(extraout_var,iVar1),&local_18,1);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_38,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&SStack_38);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x170))
                             ((long *)CONCAT44(extraout_var_00,iVar1),2);
  SimpleString::SimpleString(&local_18,"p");
  (**(code **)(*plVar3 + 0x38))(plVar3,&local_18,1);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_38,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&SStack_38);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x170))
            ((long *)CONCAT44(extraout_var_01,iVar1),1);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

TEST(MockCallTest, OnObjectIgnored_InitialMatchDiscarded)
{
    void* objectPtr1 = (void*) 0x001;
    void* objectPtr2 = (void*) 0x002;

    mock().expectOneCall("boo");
    mock().expectOneCall("boo").withBoolParameter("p", true);
    mock().actualCall("boo").onObject(objectPtr2).withBoolParameter("p", true);
    mock().actualCall("boo").onObject(objectPtr1);
}